

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle2.cpp
# Opt level: O0

void __thiscall
OpenMD::GofRAngle2::processNonOverlapping
          (GofRAngle2 *this,SelectionManager *sman1,SelectionManager *sman2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SelectionManager *in_RDI;
  int k;
  int j;
  int i;
  StuntDouble *sd3;
  StuntDouble *sd2;
  StuntDouble *sd1;
  SelectionSet *in_stack_ffffffffffffff88;
  SelectionManager *in_stack_ffffffffffffff98;
  RadialDistrFunc *in_stack_ffffffffffffffa0;
  SelectionEvaluator *in_stack_ffffffffffffffb8;
  StuntDouble *local_30;
  StuntDouble *local_28;
  StuntDouble *local_20;
  
  if (((ulong)in_RDI[0x14].nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish & 1) == 0) {
    RadialDistrFunc::processNonOverlapping
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDI);
  }
  else {
    bVar1 = SelectionEvaluator::isDynamic
                      ((SelectionEvaluator *)
                       &in_RDI[0x15].nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      in_stack_ffffffffffffff88 = (SelectionSet *)&stack0xffffffffffffffa8;
      SelectionEvaluator::evaluate(in_stack_ffffffffffffffb8);
      SelectionManager::setSelectionSet(in_RDI,in_stack_ffffffffffffff88);
      SelectionSet::~SelectionSet((SelectionSet *)0x15353e);
    }
    iVar2 = SelectionManager::getSelectionCount((SelectionManager *)0x153567);
    iVar3 = SelectionManager::getSelectionCount((SelectionManager *)0x15357c);
    if (iVar2 != iVar3) {
      RadialDistrFunc::processNonOverlapping
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDI);
    }
    local_20 = SelectionManager::beginSelected(in_RDI,(int *)in_stack_ffffffffffffff88);
    local_30 = SelectionManager::beginSelected(in_RDI,(int *)in_stack_ffffffffffffff88);
    while (local_20 != (StuntDouble *)0x0 && local_30 != (StuntDouble *)0x0) {
      local_28 = SelectionManager::beginSelected(in_RDI,(int *)in_stack_ffffffffffffff88);
      while (local_28 != (StuntDouble *)0x0) {
        (**(code **)&in_RDI->info_->nGlobalTorsions_)(in_RDI,local_20,local_28,local_30);
        local_28 = SelectionManager::nextSelected(in_RDI,(int *)in_stack_ffffffffffffff88);
      }
      local_20 = SelectionManager::nextSelected(in_RDI,(int *)in_stack_ffffffffffffff88);
      local_30 = SelectionManager::nextSelected(in_RDI,(int *)in_stack_ffffffffffffff88);
    }
  }
  return;
}

Assistant:

void GofRAngle2::processNonOverlapping(SelectionManager& sman1,
                                         SelectionManager& sman2) {
    StuntDouble* sd1;
    StuntDouble* sd2;
    StuntDouble* sd3;
    int i;
    int j;
    int k;

    // This is the same as a non-overlapping pairwise loop structure:
    // for (int i = 0;  i < ni ; ++i ) {
    //   for (int j = 0; j < nj; ++j) {}
    // }

    if (doSele3_) {
      if (evaluator3_.isDynamic()) {
        seleMan3_.setSelectionSet(evaluator3_.evaluate());
      }
      if (sman1.getSelectionCount() != seleMan3_.getSelectionCount()) {
        RadialDistrFunc::processNonOverlapping(sman1, sman2);
      }

      for (sd1 = sman1.beginSelected(i), sd3 = seleMan3_.beginSelected(k);
           sd1 != NULL && sd3 != NULL;
           sd1 = sman1.nextSelected(i), sd3 = seleMan3_.nextSelected(k)) {
        for (sd2 = sman2.beginSelected(j); sd2 != NULL;
             sd2 = sman2.nextSelected(j)) {
          collectHistogram(sd1, sd2, sd3);
        }
      }
    } else {
      RadialDistrFunc::processNonOverlapping(sman1, sman2);
    }
  }